

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextengine.cpp
# Opt level: O3

bool __thiscall
QTextLineItemIterator::getSelectionBounds
          (QTextLineItemIterator *this,QFixed *selectionX,QFixed *selectionWidth)

{
  ushort uVar1;
  ushort uVar2;
  int iVar3;
  FormatRange *pFVar4;
  QScriptItem *si;
  QTextEngine *this_00;
  LayoutData *pLVar5;
  QFixed *pQVar6;
  QGlyphJustification *pQVar7;
  QGlyphAttributes *pQVar8;
  int iVar9;
  long lVar10;
  QFixed QVar11;
  QFixed QVar12;
  int iVar13;
  int iVar14;
  long lVar15;
  ulong uVar16;
  unsigned_short *puVar17;
  ulong uVar18;
  ulong uVar19;
  int iVar20;
  int iVar21;
  
  selectionWidth->val = 0;
  selectionX->val = 0;
  pFVar4 = this->selection;
  if (pFVar4 == (FormatRange *)0x0) {
    return false;
  }
  si = this->si;
  if (((uint)si->analysis & 0xf00) < 0x601) {
    iVar14 = pFVar4->start;
    iVar9 = this->itemStart;
    if (this->itemStart <= iVar14) {
      iVar9 = iVar14;
    }
    iVar14 = iVar14 + pFVar4->length;
    if (this->itemEnd < iVar14) {
      iVar14 = this->itemEnd;
    }
    if (iVar14 <= iVar9) {
      return false;
    }
    this_00 = this->eng;
    pLVar5 = this_00->layoutData;
    iVar3 = si->position;
    lVar15 = (long)si->glyph_data_offset;
    pQVar6 = (pLVar5->glyphLayout).advances;
    pQVar7 = (pLVar5->glyphLayout).justifications;
    pQVar8 = (pLVar5->glyphLayout).attributes;
    iVar14 = iVar14 - iVar3;
    uVar1 = pLVar5->logClustersPtr[(long)iVar3 + (long)(iVar9 - iVar3)];
    uVar19 = (ulong)uVar1;
    puVar17 = pLVar5->logClustersPtr + (long)iVar3 + (long)iVar14;
    if (iVar14 == this->itemLength) {
      puVar17 = &si->num_glyphs;
    }
    uVar2 = *puVar17;
    uVar16 = (ulong)uVar2;
    if (((uint)si->analysis >> 0x10 & 1) == 0) {
      uVar16 = (ulong)this->glyphsStart;
      iVar13 = 0;
      iVar21 = 0;
      if (this->glyphsStart < (int)(uint)uVar1) {
        iVar21 = 0;
        do {
          iVar20 = (*(uint *)(pQVar7 + uVar16 * 4 + lVar15 * 4) >> 8) + pQVar6[lVar15 + uVar16].val;
          if (((byte)pQVar8[uVar16 + lVar15] & 2) != 0) {
            iVar20 = 0;
          }
          iVar21 = iVar21 + iVar20;
          uVar16 = uVar16 + 1;
        } while (uVar19 != uVar16);
      }
      if (uVar1 < uVar2) {
        iVar13 = 0;
        do {
          iVar20 = (*(uint *)(pQVar7 + uVar19 * 4 + lVar15 * 4) >> 8) + pQVar6[lVar15 + uVar19].val;
          if (((byte)pQVar8[uVar19 + lVar15] & 2) != 0) {
            iVar20 = 0;
          }
          iVar13 = iVar13 + iVar20;
          uVar19 = uVar19 + 1;
        } while (uVar2 != uVar19);
      }
    }
    else {
      uVar18 = (ulong)(uint)this->glyphsEnd;
      iVar13 = 0;
      lVar10 = lVar15 * 4 + -4;
      iVar21 = 0;
      if ((int)(uint)uVar2 < this->glyphsEnd) {
        do {
          iVar20 = (*(uint *)(pQVar7 + uVar18 * 4 + lVar10) >> 8) +
                   pQVar6[lVar15 + (uVar18 - 1)].val;
          if (((byte)pQVar8[uVar18 + lVar15 + -1] & 2) != 0) {
            iVar20 = 0;
          }
          uVar18 = uVar18 - 1;
          iVar21 = iVar21 + iVar20;
        } while ((long)uVar16 < (long)uVar18);
      }
      if (uVar1 < uVar2) {
        iVar13 = 0;
        do {
          iVar20 = (*(uint *)(pQVar7 + uVar16 * 4 + lVar10) >> 8) +
                   pQVar6[lVar15 + (uVar16 - 1)].val;
          if (((byte)pQVar8[uVar16 + lVar15 + -1] & 2) != 0) {
            iVar20 = 0;
          }
          uVar16 = uVar16 - 1;
          iVar13 = iVar13 + iVar20;
        } while ((long)uVar19 < (long)uVar16);
      }
    }
    QVar11 = QTextEngine::offsetInLigature(this_00,si,iVar9 - iVar3,iVar14,(uint)uVar1);
    selectionX->val = iVar21 + QVar11.val + (this->x).val;
    selectionWidth->val = iVar13 - QVar11.val;
    QVar12 = QTextEngine::offsetInLigature(this_00,si,iVar14,this->itemLength,(uint)uVar2);
    iVar14 = QVar12.val + (iVar13 - QVar11.val);
  }
  else {
    if ((pFVar4->length + pFVar4->start <= si->position) ||
       (si->position + this->itemLength <= pFVar4->start)) {
      return false;
    }
    selectionX->val = (this->x).val;
    iVar14 = (this->itemWidth).val;
  }
  selectionWidth->val = iVar14;
  return true;
}

Assistant:

bool QTextLineItemIterator::getSelectionBounds(QFixed *selectionX, QFixed *selectionWidth) const
{
    *selectionX = *selectionWidth = 0;

    if (!selection)
        return false;

    if (si->analysis.flags >= QScriptAnalysis::TabOrObject) {
        if (si->position >= selection->start + selection->length
            || si->position + itemLength <= selection->start)
            return false;

        *selectionX = x;
        *selectionWidth = itemWidth;
    } else {
        unsigned short *logClusters = eng->logClusters(si);
        QGlyphLayout glyphs = eng->shapedGlyphs(si);

        int from = qMax(itemStart, selection->start) - si->position;
        int to = qMin(itemEnd, selection->start + selection->length) - si->position;
        if (from >= to)
            return false;

        int start_glyph = logClusters[from];
        int end_glyph = (to == itemLength) ? si->num_glyphs : logClusters[to];
        QFixed soff;
        QFixed swidth;
        if (si->analysis.bidiLevel %2) {
            for (int g = glyphsEnd - 1; g >= end_glyph; --g)
                soff += glyphs.effectiveAdvance(g);
            for (int g = end_glyph - 1; g >= start_glyph; --g)
                swidth += glyphs.effectiveAdvance(g);
        } else {
            for (int g = glyphsStart; g < start_glyph; ++g)
                soff += glyphs.effectiveAdvance(g);
            for (int g = start_glyph; g < end_glyph; ++g)
                swidth += glyphs.effectiveAdvance(g);
        }

        // If the starting character is in the middle of a ligature,
        // selection should only contain the right part of that ligature
        // glyph, so we need to get the width of the left part here and
        // add it to *selectionX
        QFixed leftOffsetInLigature = eng->offsetInLigature(si, from, to, start_glyph);
        *selectionX = x + soff + leftOffsetInLigature;
        *selectionWidth = swidth - leftOffsetInLigature;
        // If the ending character is also part of a ligature, swidth does
        // not contain that part yet, we also need to find out the width of
        // that left part
        *selectionWidth += eng->offsetInLigature(si, to, itemLength, end_glyph);
    }
    return true;
}